

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall
despot::MemoryPool<despot::RegDemoState>::~MemoryPool(MemoryPool<despot::RegDemoState> *this)

{
  pointer ppRVar1;
  pointer ppCVar2;
  
  DeleteAll(this);
  ppRVar1 = (this->freelist_).
            super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar1 != (pointer)0x0) {
    operator_delete(ppRVar1,(long)(this->freelist_).
                                  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar1
                   );
  }
  ppCVar2 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::RegDemoState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RegDemoState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->chunks_).
                                  super__Vector_base<despot::MemoryPool<despot::RegDemoState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RegDemoState>::Chunk_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
    return;
  }
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}